

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_limit_aspect_ratio(REF_DBL *metric,REF_GRID ref_grid,REF_DBL aspect_ratio)

{
  undefined1 auVar1 [16];
  double dVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 local_98 [16];
  double local_88;
  
  dVar2 = (double)(~-(ulong)(0.9999 < aspect_ratio) & 0x426d1a94a2000000 |
                  (ulong)(aspect_ratio * aspect_ratio) & -(ulong)(0.9999 < aspect_ratio));
  if (ref_grid->twod == 0) {
    dVar8 = dVar2 * 1e+20;
    if (dVar8 <= -dVar8) {
      dVar8 = -dVar8;
    }
    uVar4 = 0;
    lVar7 = 0;
    do {
      if (ref_grid->node->max <= lVar7) {
        return 0;
      }
      if (-1 < ref_grid->node->global[lVar7]) {
        uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
        if (uVar3 != 0) {
          pcVar6 = "eigen decomp";
          uVar5 = 0x7f8;
          goto LAB_001be925;
        }
        dVar9 = local_98._8_8_;
        if (local_98._8_8_ <= local_98._0_8_) {
          dVar9 = local_98._0_8_;
        }
        dVar11 = local_88;
        if (local_88 <= dVar9) {
          dVar11 = dVar9;
        }
        dVar9 = dVar11;
        if (dVar11 <= -dVar11) {
          dVar9 = -dVar11;
        }
        if (dVar8 <= dVar9) {
          uVar4 = 0x7fc;
          goto LAB_001be8f5;
        }
        auVar10._0_8_ = dVar11 / dVar2;
        if (local_88 <= auVar10._0_8_) {
          local_88 = auVar10._0_8_;
        }
        auVar10._8_8_ = auVar10._0_8_;
        local_98 = maxpd(local_98,auVar10);
        uVar3 = ref_matrix_form_m((REF_DBL *)local_98,metric);
        if (uVar3 != 0) {
          pcVar6 = "reform m";
          uVar5 = 0x804;
          goto LAB_001be925;
        }
      }
      lVar7 = lVar7 + 1;
      metric = metric + 6;
    } while( true );
  }
  dVar8 = dVar2 * 1e+20;
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  uVar4 = 0;
  lVar7 = 0;
  do {
    if (ref_grid->node->max <= lVar7) {
      return 0;
    }
    if (-1 < ref_grid->node->global[lVar7]) {
      uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
      if (uVar3 != 0) {
        pcVar6 = "eigen decomp";
        uVar5 = 0x7e9;
LAB_001be925:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar5,"ref_metric_limit_aspect_ratio",(ulong)uVar3,pcVar6,dVar8,uVar4);
        return uVar3;
      }
      uVar3 = ref_matrix_descending_eig_twod((REF_DBL *)local_98);
      if (uVar3 != 0) {
        pcVar6 = "2D eig sort";
        uVar5 = 0x7ea;
        goto LAB_001be925;
      }
      dVar9 = local_98._8_8_;
      if (local_98._8_8_ <= local_98._0_8_) {
        dVar9 = local_98._0_8_;
      }
      dVar11 = dVar9;
      if (dVar9 <= -dVar9) {
        dVar11 = -dVar9;
      }
      if (dVar8 <= dVar11) {
        uVar4 = 0x7ed;
LAB_001be8f5:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar4,"ref_metric_limit_aspect_ratio","AR div zero");
        return 1;
      }
      auVar1._8_8_ = dVar9 / dVar2;
      auVar1._0_8_ = dVar9 / dVar2;
      local_98 = maxpd(local_98,auVar1);
      uVar3 = ref_matrix_form_m((REF_DBL *)local_98,metric);
      if (uVar3 != 0) {
        pcVar6 = "reform m";
        uVar5 = 0x7f3;
        goto LAB_001be925;
      }
      uVar3 = ref_matrix_twod_m(metric);
      if (uVar3 != 0) {
        pcVar6 = "enforce 2D m for roundoff";
        uVar5 = 0x7f4;
        goto LAB_001be925;
      }
    }
    lVar7 = lVar7 + 1;
    metric = metric + 6;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_aspect_ratio(REF_DBL *metric,
                                                 REF_GRID ref_grid,
                                                 REF_DBL aspect_ratio) {
  REF_DBL diag_system[12];
  REF_DBL max_eig, limit_eig;
  REF_INT node;
  REF_DBL aspect_ratio2;
  if (aspect_ratio > 0.9999) {
    aspect_ratio2 = aspect_ratio * aspect_ratio;
  } else {
    aspect_ratio2 = 1.0e6 * 1.0e6;
  }
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      RSS(ref_matrix_descending_eig_twod(diag_system), "2D eig sort");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      RAS(ref_math_divisible(max_eig, aspect_ratio2), "AR div zero");
      limit_eig = max_eig / aspect_ratio2;
      ref_matrix_eig(diag_system, 0) =
          MAX(ref_matrix_eig(diag_system, 0), limit_eig);
      ref_matrix_eig(diag_system, 1) =
          MAX(ref_matrix_eig(diag_system, 1), limit_eig);
      RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
      RSS(ref_matrix_twod_m(&(metric[6 * node])), "enforce 2D m for roundoff");
    }
  } else {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      max_eig = MAX(ref_matrix_eig(diag_system, 2), max_eig);
      RAS(ref_math_divisible(max_eig, aspect_ratio2), "AR div zero");
      limit_eig = max_eig / aspect_ratio2;
      ref_matrix_eig(diag_system, 0) =
          MAX(ref_matrix_eig(diag_system, 0), limit_eig);
      ref_matrix_eig(diag_system, 1) =
          MAX(ref_matrix_eig(diag_system, 1), limit_eig);
      ref_matrix_eig(diag_system, 2) =
          MAX(ref_matrix_eig(diag_system, 2), limit_eig);
      RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
    }
  }
  return REF_SUCCESS;
}